

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O1

int it_okt_read_pattern(IT_PATTERN *pattern,uchar *data,int length,int n_channels)

{
  ushort uVar1;
  IT_ENTRY *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  
  iVar3 = -1;
  if (1 < length) {
    uVar1 = *(ushort *)data << 8 | *(ushort *)data >> 8;
    uVar10 = 0x40;
    if (uVar1 != 0) {
      uVar10 = (uint)uVar1;
    }
    if ((int)(n_channels * 4 * uVar10 | 2) <= length) {
      pattern->n_rows = uVar10;
      pattern->n_entries = uVar10;
      iVar11 = uVar10 + (uVar10 == 0);
      iVar4 = 2;
      iVar6 = 0;
      do {
        if (0 < n_channels) {
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + n_channels * 4;
          lVar7 = 0;
          do {
            if (data[lVar7 * 4 + lVar5 + 2] != '\0' || data[lVar7 * 4 + lVar5] != '\0') {
              pattern->n_entries = pattern->n_entries + 1;
            }
            lVar7 = lVar7 + 1;
          } while (n_channels != (int)lVar7);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != iVar11);
      pIVar2 = (IT_ENTRY *)malloc((long)pattern->n_entries * 7);
      pattern->entry = pIVar2;
      if (pIVar2 != (IT_ENTRY *)0x0) {
        iVar3 = 2;
        iVar4 = 0;
        do {
          if (0 < n_channels) {
            lVar7 = (long)iVar3;
            lVar5 = lVar7 + 3;
            lVar8 = 0;
            do {
              if (data[lVar8 * 4 + lVar7 + 2] != '\0' || data[lVar8 * 4 + lVar7] != '\0') {
                pIVar2->channel = (uchar)lVar8;
                pIVar2->mask = '\0';
                if ((byte)(data[lVar8 * 4 + lVar7] - 1) < 0x24) {
                  pIVar2->mask = '\x03';
                  pIVar2->note = data[lVar8 * 4 + lVar7] + '#';
                  pIVar2->instrument = data[lVar8 * 4 + lVar7 + 1] + '\x01';
                }
                pIVar2->effect = '\0';
                pIVar2->effectvalue = data[lVar8 * 4 + lVar5];
                switch(data[lVar8 * 4 + lVar7 + 2]) {
                case '\x01':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = '\x06';
                  }
                  break;
                case '\x02':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = '\x05';
                  }
                  break;
                case '\n':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = '*';
                  }
                  break;
                case '\v':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = '+';
                  }
                  break;
                case '\f':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = ',';
                  }
                  break;
                case '\r':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = '&';
                  }
                  break;
                case '\x0f':
                  pIVar2->effect = '\x13';
                  bVar9 = data[lVar8 * 4 + lVar5] & 0xf;
LAB_006e6ad2:
                  pIVar2->effectvalue = bVar9;
                  break;
                case '\x11':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = '(';
                  }
                  break;
                case '\x15':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = '\'';
                  }
                  break;
                case '\x19':
                  pIVar2->effect = '\x02';
                  break;
                case '\x1b':
                  pIVar2->note = 0xff;
                  pIVar2->mask = pIVar2->mask | 1;
                  break;
                case '\x1c':
                  pIVar2->effect = '\x01';
                  break;
                case '\x1e':
                  if (data[lVar8 * 4 + lVar5] != '\0') {
                    pIVar2->effect = ')';
                  }
                  break;
                case '\x1f':
                  bVar9 = data[lVar8 * 4 + lVar5];
                  if (0x40 < bVar9) {
                    if (bVar9 < 0x51) {
                      pIVar2->effect = '-';
                      bVar9 = data[lVar8 * 4 + lVar5] - 0x40;
                    }
                    else {
                      if (bVar9 < 0x61) {
                        pIVar2->effect = '.';
                      }
                      else {
                        if (0x70 < bVar9) {
                          if (0x80 < bVar9) break;
                          pIVar2->effect = '.';
                          bVar9 = data[lVar8 * 4 + lVar5] + 0xa0;
                          goto LAB_006e6ad2;
                        }
                        pIVar2->effect = '-';
                      }
                      bVar9 = data[lVar8 * 4 + lVar5] + 0xb0;
                    }
                    goto LAB_006e6ad2;
                  }
                  pIVar2->effect = '\r';
                }
                if (pIVar2->effect != '\0') {
                  pIVar2->mask = pIVar2->mask | 8;
                }
                pIVar2 = pIVar2 + 1;
              }
              lVar8 = lVar8 + 1;
              iVar3 = iVar3 + 4;
            } while (n_channels != (int)lVar8);
          }
          pIVar2->channel = 0xff;
          pIVar2 = pIVar2 + 1;
          iVar4 = iVar4 + 1;
        } while (iVar4 != iVar11);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int it_okt_read_pattern(IT_PATTERN *pattern, const unsigned char *data, int length, int n_channels)
{
	int pos;
	int channel;
	int row;
	int n_rows;
	IT_ENTRY *entry;

	if (length < 2) return -1;

	n_rows = (data[0] << 8) | data[1];
	if (!n_rows) n_rows = 64;

	if (length < 2 + (n_rows * n_channels * 4)) return -1;

	pattern->n_rows = n_rows;

	/* compute number of entries */
	pattern->n_entries = n_rows; /* Account for the row end markers */
	pos = 2;
	for (row = 0; row < pattern->n_rows; row++) {
		for (channel = 0; channel < n_channels; channel++) {
			if (data[pos+0] | data[pos+2])
				pattern->n_entries++;
			pos += 4;
		}
	}

	pattern->entry = (IT_ENTRY *) malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	entry = pattern->entry;
	pos = 2;
	for (row = 0; row < n_rows; row++) {
		for (channel = 0; channel < n_channels; channel++) {
			if (data[pos+0] | data[pos+2]) {
				entry->channel = channel;
				entry->mask = 0;

				if (data[pos+0] > 0 && data[pos+0] <= 36) {
					entry->mask |= IT_ENTRY_NOTE | IT_ENTRY_INSTRUMENT;

					entry->note = data[pos+0] + 35;
					entry->instrument = data[pos+1] + 1;
				}

				entry->effect = 0;
				entry->effectvalue = data[pos+3];

				switch (data[pos+2]) {
				case  2: if (data[pos+3]) entry->effect = IT_PORTAMENTO_DOWN; break; // XXX code calls this rs_portu, but it's adding to the period, which decreases the pitch
				case 13: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_DOWN; break;
				case 21: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_DOWN_ROW; break;

				case  1: if (data[pos+3]) entry->effect = IT_PORTAMENTO_UP; break;   // XXX same deal here, increasing the pitch
				case 17: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_UP; break;
				case 30: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_UP_ROW; break;

				case 10: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_3; break;
				case 11: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_4; break;
				case 12: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_5; break;

				case 15: entry->effect = IT_S; entry->effectvalue = EFFECT_VALUE(IT_S_SET_FILTER, data[pos+3] & 0x0F); break;

				case 25: entry->effect = IT_JUMP_TO_ORDER; break;

				case 27: entry->note = IT_NOTE_OFF; entry->mask |= IT_ENTRY_NOTE; break;

				case 28: entry->effect = IT_SET_SPEED; break;

				case 31:
					if ( data[pos+3] <= 0x40 ) entry->effect = IT_SET_CHANNEL_VOLUME;
					else if ( data[pos+3] <= 0x50 ) { entry->effect = IT_OKT_VOLUME_SLIDE_DOWN; entry->effectvalue = data[pos+3] - 0x40; }
					else if ( data[pos+3] <= 0x60 ) { entry->effect = IT_OKT_VOLUME_SLIDE_UP;   entry->effectvalue = data[pos+3] - 0x50; }
					else if ( data[pos+3] <= 0x70 ) { entry->effect = IT_OKT_VOLUME_SLIDE_DOWN; entry->effectvalue = data[pos+3] - 0x50; }
					else if ( data[pos+3] <= 0x80 ) { entry->effect = IT_OKT_VOLUME_SLIDE_UP;   entry->effectvalue = data[pos+3] - 0x60; }
					break;
				}

				if ( entry->effect ) entry->mask |= IT_ENTRY_EFFECT;

				entry++;
			}
			pos += 4;
		}
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}